

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O2

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  XmlOutput *pXVar1;
  XmlOutput *pXVar2;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_160;
  QArrayDataPointer<char16_t> local_148;
  xml_output local_130;
  QArrayDataPointer<char16_t> local_f8;
  xml_output local_e0;
  QArrayDataPointer<char16_t> local_a8;
  xml_output local_90;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  pXVar2 = (XmlOutput *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = -0x5555555555555556;
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  generateCondition((QString *)&local_58,*(VCConfiguration **)((long)__buf + 0x98));
  if (*(long *)((long)__buf + 0x18) != 0) {
    QString::QString((QString *)&local_a8,"AdditionalInputs");
    tag(&local_90,(QString *)&local_a8);
    pXVar1 = XmlOutput::operator<<(pXVar2,&local_90);
    QString::QString((QString *)&local_f8,"Condition");
    attributeTag(&local_e0,(QString *)&local_f8,(QString *)&local_58);
    pXVar1 = XmlOutput::operator<<(pXVar1,&local_e0);
    QString::QString((QString *)&local_148,"AdditionalInputs");
    valueTagDefX(&local_130,(QStringList *)((long)__buf + 8),(QString *)&local_148,";");
    XmlOutput::operator<<(pXVar1,&local_130);
    XmlOutput::xml_output::~xml_output(&local_130);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
    XmlOutput::xml_output::~xml_output(&local_e0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    XmlOutput::xml_output::~xml_output(&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  }
  if (*(long *)((long)__buf + 0x30) != 0) {
    QString::QString((QString *)&local_a8,"Command");
    tag(&local_90,(QString *)&local_a8);
    pXVar1 = XmlOutput::operator<<(pXVar2,&local_90);
    QString::QString((QString *)&local_f8,"Condition");
    attributeTag(&local_e0,(QString *)&local_f8,(QString *)&local_58);
    pXVar1 = XmlOutput::operator<<(pXVar1,&local_e0);
    local_160.d = *(Data **)((long)__buf + 0x20);
    local_160.ptr = *(QString **)((long)__buf + 0x28);
    local_160.size = *(qsizetype *)((long)__buf + 0x30);
    if (local_160.d != (Data *)0x0) {
      LOCK();
      ((local_160.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_160.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    commandLinesForOutput((QString *)&local_148,(QStringList *)&local_160);
    valueTag(&local_130,(QString *)&local_148);
    XmlOutput::operator<<(pXVar1,&local_130);
    XmlOutput::xml_output::~xml_output(&local_130);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_160);
    XmlOutput::xml_output::~xml_output(&local_e0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    XmlOutput::xml_output::~xml_output(&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  }
  if (*(long *)((long)__buf + 0x48) != 0) {
    QString::QString((QString *)&local_a8,"Message");
    tag(&local_90,(QString *)&local_a8);
    pXVar1 = XmlOutput::operator<<(pXVar2,&local_90);
    QString::QString((QString *)&local_f8,"Condition");
    attributeTag(&local_e0,(QString *)&local_f8,(QString *)&local_58);
    pXVar1 = XmlOutput::operator<<(pXVar1,&local_e0);
    valueTag(&local_130,(QString *)((long)__buf + 0x38));
    XmlOutput::operator<<(pXVar1,&local_130);
    XmlOutput::xml_output::~xml_output(&local_130);
    XmlOutput::xml_output::~xml_output(&local_e0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    XmlOutput::xml_output::~xml_output(&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  }
  if (*(long *)((long)__buf + 0x60) != 0) {
    QString::QString((QString *)&local_a8,"Outputs");
    tag(&local_90,(QString *)&local_a8);
    pXVar2 = XmlOutput::operator<<(pXVar2,&local_90);
    QString::QString((QString *)&local_f8,"Condition");
    attributeTag(&local_e0,(QString *)&local_f8,(QString *)&local_58);
    pXVar2 = XmlOutput::operator<<(pXVar2,&local_e0);
    QString::QString((QString *)&local_148,"Outputs");
    valueTagDefX(&local_130,(QStringList *)((long)__buf + 0x50),(QString *)&local_148,";");
    XmlOutput::operator<<(pXVar2,&local_130);
    XmlOutput::xml_output::~xml_output(&local_130);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
    XmlOutput::xml_output::~xml_output(&local_e0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    XmlOutput::xml_output::~xml_output(&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCCustomBuildTool &tool)
{
    const QString condition = generateCondition(*tool.config);

    if ( !tool.AdditionalDependencies.isEmpty() )
    {
        xml << tag("AdditionalInputs")
            << attrTag("Condition", condition)
            << valueTagDefX(tool.AdditionalDependencies, "AdditionalInputs", ";");
    }

    if( !tool.CommandLine.isEmpty() )
    {
        xml << tag("Command")
            << attrTag("Condition", condition)
            << valueTag(commandLinesForOutput(tool.CommandLine));
    }

    if ( !tool.Description.isEmpty() )
    {
        xml << tag("Message")
            << attrTag("Condition", condition)
            << valueTag(tool.Description);
    }

    if ( !tool.Outputs.isEmpty() )
    {
        xml << tag("Outputs")
            << attrTag("Condition", condition)
            << valueTagDefX(tool.Outputs, "Outputs", ";");
    }
}